

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

llama_sampler * llama_sampler_clone(llama_sampler *smpl)

{
  llama_sampler_i *plVar1;
  _func_llama_sampler_ptr_llama_sampler_ptr *UNRECOVERED_JUMPTABLE;
  llama_sampler *plVar2;
  
  plVar1 = smpl->iface;
  UNRECOVERED_JUMPTABLE = plVar1->clone;
  if (UNRECOVERED_JUMPTABLE != (_func_llama_sampler_ptr_llama_sampler_ptr *)0x0) {
    plVar2 = (*UNRECOVERED_JUMPTABLE)(smpl);
    return plVar2;
  }
  if (smpl->ctx == (llama_sampler_context_t)0x0) {
    plVar2 = (llama_sampler *)operator_new(0x10);
    plVar2->iface = plVar1;
    plVar2->ctx = (llama_sampler_context_t)0x0;
    return plVar2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
             ,0x16b,"the sampler does not support cloning");
}

Assistant:

struct llama_sampler * llama_sampler_clone(const struct llama_sampler * smpl) {
    if (smpl->iface->clone) {
        return smpl->iface->clone(smpl);
    }

    if (smpl->ctx == nullptr) {
        return llama_sampler_init(
            /* .iface = */ smpl->iface,
            /* .ctx   = */ nullptr
        );
    }

    GGML_ABORT("the sampler does not support cloning");
}